

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O2

bool SanityTest(pfHash hash,int hashbits)

{
  void *__dest;
  byte bVar1;
  int len;
  int iVar2;
  void *blob;
  void *blob_00;
  void *__s;
  void *__s_00;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t bit;
  int iVar6;
  char *__format;
  size_t __n;
  char *__s_01;
  uint32_t local_94;
  Rand r;
  
  printf("Running sanity check 1     ");
  Rand::reseed(&r,0xd7c1d);
  uVar4 = hashbits / 8;
  blob = operator_new__(0x130);
  blob_00 = operator_new__(0x130);
  uVar5 = (ulong)(int)uVar4;
  __s = operator_new__(uVar5);
  __s_00 = operator_new__(uVar5);
  memset(__s,1,uVar5);
  memset(__s_00,2,uVar5);
  for (iVar6 = 0; __s_01 = " PASS", iVar6 != 10; iVar6 = iVar6 + 1) {
    putchar(0x2e);
    local_94 = 0x20;
    for (__n = 4; __n != 0x101; __n = __n + 1) {
      for (lVar3 = 0x10; lVar3 != 0x20; lVar3 = lVar3 + 1) {
        __dest = (void *)((long)blob_00 + lVar3 + 0x10);
        Rand::rand_p(&r,blob,0x130);
        Rand::rand_p(&r,blob_00,0x130);
        memcpy(__dest,(void *)((long)blob + 0x10),__n);
        bit = 0;
        len = (int)__n;
        (*hash)((void *)((long)blob + 0x10),len,0,__s);
        while (local_94 != bit) {
          flipbit(__dest,len,bit);
          (*hash)(__dest,len,0,__s_00);
          iVar2 = bcmp(__s,__s_00,uVar5);
          if (iVar2 == 0) {
            __s_01 = " FAIL  !!!!!";
            uVar5 = 0;
            goto LAB_0015bd37;
          }
          flipbit(__dest,len,bit);
          (*hash)(__dest,len,0,__s_00);
          iVar2 = bcmp(__s,__s_00,uVar5);
          bit = bit + 1;
          if (iVar2 != 0) {
            __s_01 = " FAIL  !!!!!";
            uVar5 = 0;
            goto LAB_0015bd67;
          }
        }
      }
      local_94 = local_94 + 8;
    }
  }
LAB_0015bd98:
  puts(__s_01);
  operator_delete__(blob);
  operator_delete__(blob_00);
  operator_delete__(__s);
  operator_delete__(__s_00);
  return iVar6 == 10;
LAB_0015bd37:
  if ((~((int)uVar4 >> 0x1f) & uVar4) == uVar5) goto LAB_0015bd98;
  bVar1 = *(byte *)((long)__s + uVar5);
  if (bVar1 == *(byte *)((long)__s_00 + uVar5)) {
    __format = " %d: 0x%02X == 0x%02X ";
    goto LAB_0015bd91;
  }
  uVar5 = uVar5 + 1;
  goto LAB_0015bd37;
LAB_0015bd67:
  if ((~((int)uVar4 >> 0x1f) & uVar4) == uVar5) goto LAB_0015bd98;
  bVar1 = *(byte *)((long)__s + uVar5);
  if (bVar1 != *(byte *)((long)__s_00 + uVar5)) {
    __format = " %d: 0x%02X != 0x%02X ";
LAB_0015bd91:
    __s_01 = " FAIL  !!!!!";
    printf(__format,uVar5,(ulong)bVar1);
    goto LAB_0015bd98;
  }
  uVar5 = uVar5 + 1;
  goto LAB_0015bd67;
}

Assistant:

bool SanityTest ( pfHash hash, const int hashbits )
{
  printf("Running sanity check 1     ");

  Rand r(883741);

  bool result = true;

  const int hashbytes = hashbits/8;
  const int reps = 10;
  const int keymax = 256;
  const int pad = 16;
  const int buflen = keymax + pad*3;

  uint8_t * buffer1 = new uint8_t[buflen];
  uint8_t * buffer2 = new uint8_t[buflen];

  uint8_t * hash1 = new uint8_t[hashbytes];
  uint8_t * hash2 = new uint8_t[hashbytes];

  //----------
  memset(hash1, 1, hashbytes);
  memset(hash2, 2, hashbytes);
  
  for(int irep = 0; irep < reps; irep++)
  {
    if(irep % (reps/10) == 0) printf(".");

    for(int len = 4; len <= keymax; len++)
    {
      for(int offset = pad; offset < pad*2; offset++)
      {
        uint8_t * key1 = &buffer1[pad];
        uint8_t * key2 = &buffer2[pad+offset];

        r.rand_p(buffer1,buflen);
        r.rand_p(buffer2,buflen);

        memcpy(key2,key1,len);

        hash(key1,len,0,hash1);

        for(int bit = 0; bit < (len * 8); bit++)
        {
          // Flip a bit, hash the key -> we should get a different result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) == 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] == hash2[i]) {
                  printf(" %d: 0x%02X == 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }

          // Flip it back, hash again -> we should get the original result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) != 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] != hash2[i]) {
                  printf(" %d: 0x%02X != 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }
        }
      }
    }
  }

 end_sanity:
  if(result == false)
  {
    printf(" FAIL  !!!!!\n");
  }
  else
  {
    printf(" PASS\n");
  }

  delete [] buffer1;
  delete [] buffer2;

  delete [] hash1;
  delete [] hash2;

  return result;
}